

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool upb_inttable_next(upb_inttable *t,uintptr_t *key,upb_value *val,intptr_t *iter)

{
  upb_tabent *puVar1;
  uintptr_t uVar2;
  _Bool _Var3;
  ulong uVar4;
  upb_value *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uintptr_t val_1;
  ulong key_00;
  
  uVar6 = *iter;
  uVar8 = (ulong)t->array_size;
  if (uVar8 < uVar6 + 1) {
LAB_0028558b:
    uVar4 = uVar6 - uVar8;
    lVar7 = uVar6 * 0x18 + uVar8 * -0x18 + 0x20;
    key_00 = 0x7ffffffffffffffe;
    do {
      uVar4 = uVar4 + 1;
      if ((t->t).mask + 1 <= uVar4) {
        _Var3 = false;
        goto LAB_0028561d;
      }
      puVar1 = (t->t).entries;
      uVar2 = *(uintptr_t *)((long)&(puVar1->val).val + lVar7);
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar2 == 0);
    *key = uVar2;
    val->val = puVar1[uVar4].val.val;
    _Var3 = true;
    key_00 = uVar6;
  }
  else {
    do {
      key_00 = uVar6 + 1;
      uVar8 = (ulong)t->array_size;
      if (uVar8 <= key_00) goto LAB_0028558b;
      puVar5 = inttable_array_get(t,key_00);
      uVar6 = key_00;
    } while (puVar5 == (upb_value *)0x0);
    *key = key_00;
    val->val = puVar5->val;
    _Var3 = true;
  }
LAB_0028561d:
  *iter = key_00;
  return _Var3;
}

Assistant:

bool upb_inttable_next(const upb_inttable* t, uintptr_t* key, upb_value* val,
                       intptr_t* iter) {
  intptr_t i = *iter;
  if ((size_t)(i + 1) <= t->array_size) {
    while ((size_t)++i < t->array_size) {
      const upb_value* ent = inttable_array_get(t, i);
      if (ent) {
        *key = i;
        *val = *ent;
        *iter = i;
        return true;
      }
    }
    i--;  // Back up to exactly one position before the start of the table.
  }

  size_t tab_idx = next(&t->t, i - t->array_size);
  if (tab_idx < upb_table_size(&t->t)) {
    upb_tabent* ent = &t->t.entries[tab_idx];
    *key = ent->key.num;
    *val = ent->val;
    *iter = tab_idx + t->array_size;
    return true;
  } else {
    // We should set the iterator any way. When we are done, the iterator value
    // is invalidated. `upb_inttable_done` will check on the iterator value to
    // determine if the iteration is done.
    *iter = INTPTR_MAX - 1;  // To disambiguate from UPB_INTTABLE_BEGIN, to
                             // match the behavior of `upb_strtable_iter`.
    return false;
  }
}